

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_repeat_search_prev(EditLine *el,wint_t c)

{
  wint_t c_00;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_search).patlen == 0) {
    el_local._7_1_ = '\x06';
  }
  else {
    c_00 = 0x18;
    if ((el->el_search).patdir == L'\x18') {
      c_00 = 0x17;
    }
    el_local._7_1_ = cv_repeat_srch(el,c_00);
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
vi_repeat_search_prev(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_search.patlen == 0)
		return CC_ERROR;
	else
		return (cv_repeat_srch(el,
		    el->el_search.patdir == ED_SEARCH_PREV_HISTORY ?
		    ED_SEARCH_NEXT_HISTORY : ED_SEARCH_PREV_HISTORY));
}